

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_deepseek2::llm_build_deepseek2
          (llm_build_deepseek2 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  llama_hparams *plVar4;
  ggml_context *pgVar5;
  pointer plVar6;
  int64_t iVar7;
  bool bVar8;
  ggml_tensor *pgVar9;
  llm_graph_input_attn_kv_unified *inp;
  long lVar10;
  long lVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  undefined8 uVar14;
  long lVar15;
  ggml_tensor *pgVar16;
  long lVar17;
  undefined8 uVar18;
  ggml_tensor *pgVar19;
  undefined8 uVar20;
  ggml_tensor *cur;
  uint32_t *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint32_t *puVar25;
  long lVar26;
  int il;
  ulong uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  long local_e8;
  ggml_tensor *local_80;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar4 = (this->super_llm_graph_context).hparams;
  if ((plVar4->n_embd_head_k_mla == 0) || (plVar4->n_embd_head_v_mla == 0)) {
    puVar21 = &plVar4->n_embd_head_k;
    puVar25 = &plVar4->n_embd_head_v;
    bVar8 = false;
  }
  else {
    puVar21 = &plVar4->n_embd_head_k_mla;
    puVar25 = &plVar4->n_embd_head_v_mla;
    bVar8 = true;
  }
  uVar1 = plVar4->n_layer;
  uVar22 = (ulong)*puVar21;
  uVar2 = *puVar25;
  uVar23 = (ulong)plVar4->n_rot;
  uVar24 = (ulong)plVar4->n_lora_kv;
  fVar30 = (this->super_llm_graph_context).attn_factor;
  fVar31 = plVar4->rope_yarn_log_mul;
  fVar28 = logf(1.0 / (this->super_llm_graph_context).freq_scale);
  fVar29 = logf(1.0 / (this->super_llm_graph_context).freq_scale);
  local_80 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar9 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  lVar26 = uVar22 - uVar23;
  fVar30 = fVar30 * (fVar31 * fVar28 + 1.0);
  fVar30 = (fVar30 * fVar30) / SQRT((float)uVar22);
  fVar31 = 1.0 / (fVar29 * 0.1 + 1.0);
  lVar10 = uVar24 + uVar23;
  lVar11 = (ulong)uVar2 + lVar26;
  local_e8 = 0;
  for (uVar27 = 0; (long)uVar27 < (this->super_llm_graph_context).n_layer; uVar27 = uVar27 + 1) {
    il = (int)uVar27;
    pgVar12 = llm_graph_context::build_norm
                        (&this->super_llm_graph_context,local_80,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->attn_norm + local_e8),
                         (ggml_tensor *)0x0,LLM_NORM_RMS,il);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"attn_norm",il);
    pgVar5 = (this->super_llm_graph_context).ctx0;
    plVar6 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar1 == 0x1b) {
      pgVar13 = (ggml_tensor *)
                ggml_mul_mat(pgVar5,*(undefined8 *)((long)&plVar6->wq + local_e8),pgVar12);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"q",il);
    }
    else {
      pgVar13 = (ggml_tensor *)
                ggml_mul_mat(pgVar5,*(undefined8 *)((long)&plVar6->wq_a + local_e8),pgVar12);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"q",il);
      pgVar13 = llm_graph_context::build_norm
                          (&this->super_llm_graph_context,pgVar13,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->attn_q_a_norm +
                            local_e8),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"q",il);
      pgVar13 = (ggml_tensor *)
                ggml_mul_mat((this->super_llm_graph_context).ctx0,
                             *(undefined8 *)
                              ((long)&((model->layers).
                                       super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->wq_b + local_e8),
                             pgVar13);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"q",il);
    }
    iVar7 = (this->super_llm_graph_context).n_head;
    pgVar5 = (this->super_llm_graph_context).ctx0;
    iVar3 = (this->super_llm_graph_context).n_tokens;
    uVar14 = ggml_row_size(pgVar13->type,uVar22);
    lVar15 = ggml_row_size(pgVar13->type,uVar22);
    pgVar16 = (ggml_tensor *)
              ggml_view_3d(pgVar5,pgVar13,lVar26,iVar7,(long)iVar3,uVar14,
                           lVar15 * (this->super_llm_graph_context).n_head,0);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar16,"q_nope",il);
    iVar7 = (this->super_llm_graph_context).n_head;
    pgVar5 = (this->super_llm_graph_context).ctx0;
    iVar3 = (this->super_llm_graph_context).n_tokens;
    uVar14 = ggml_row_size(pgVar13->type,uVar22);
    lVar17 = ggml_row_size(pgVar13->type,uVar22);
    lVar15 = (this->super_llm_graph_context).n_head;
    uVar18 = ggml_row_size(pgVar13->type,lVar26);
    pgVar13 = (ggml_tensor *)
              ggml_view_3d(pgVar5,pgVar13,uVar23,iVar7,(long)iVar3,uVar14,lVar15 * lVar17,uVar18);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"q_pe",il);
    pgVar12 = (ggml_tensor *)
              ggml_mul_mat((this->super_llm_graph_context).ctx0,
                           *(undefined8 *)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->wkv_a_mqa + local_e8
                            ),pgVar12);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"kv_cmpr_pe",il);
    pgVar5 = (this->super_llm_graph_context).ctx0;
    iVar3 = (this->super_llm_graph_context).n_tokens;
    uVar14 = ggml_row_size(pgVar12->type,lVar10);
    pgVar19 = (ggml_tensor *)ggml_view_2d(pgVar5,pgVar12,uVar24,(long)iVar3,uVar14,0);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar19,"kv_cmpr",il);
    pgVar5 = (this->super_llm_graph_context).ctx0;
    iVar3 = (this->super_llm_graph_context).n_tokens;
    uVar14 = ggml_row_size(pgVar12->type,lVar10);
    uVar18 = ggml_row_size(pgVar12->type,lVar10);
    uVar20 = ggml_row_size(pgVar12->type,uVar24);
    pgVar12 = (ggml_tensor *)ggml_view_3d(pgVar5,pgVar12,uVar23,1,(long)iVar3,uVar14,uVar18,uVar20);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"k_pe",il);
    pgVar13 = (ggml_tensor *)
              ggml_rope_ext((this->super_llm_graph_context).freq_base,
                            (this->super_llm_graph_context).freq_scale,
                            (this->super_llm_graph_context).ext_factor,fVar31,
                            (this->super_llm_graph_context).beta_fast,
                            (this->super_llm_graph_context).beta_slow,
                            (this->super_llm_graph_context).ctx0,pgVar13,pgVar9,0,
                            (int)(this->super_llm_graph_context).n_rot,
                            (this->super_llm_graph_context).rope_type,
                            (this->super_llm_graph_context).n_ctx_orig);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"q_pe",il);
    pgVar12 = (ggml_tensor *)
              ggml_rope_ext((this->super_llm_graph_context).freq_base,
                            (this->super_llm_graph_context).freq_scale,
                            (this->super_llm_graph_context).ext_factor,fVar31,
                            (this->super_llm_graph_context).beta_fast,
                            (this->super_llm_graph_context).beta_slow,
                            (this->super_llm_graph_context).ctx0,pgVar12,pgVar9,0,
                            (int)(this->super_llm_graph_context).n_rot,
                            (this->super_llm_graph_context).rope_type,
                            (this->super_llm_graph_context).n_ctx_orig);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"k_pe",il);
    pgVar19 = llm_graph_context::build_norm
                        (&this->super_llm_graph_context,pgVar19,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->attn_kv_a_norm +
                          local_e8),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar19,"kv_cmpr",il);
    pgVar5 = (this->super_llm_graph_context).ctx0;
    if (bVar8) {
      pgVar16 = (ggml_tensor *)ggml_permute(pgVar5,pgVar16,0,2,1,3);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar16,"q_nope_perm",il);
      pgVar16 = (ggml_tensor *)
                ggml_mul_mat((this->super_llm_graph_context).ctx0,
                             *(undefined8 *)
                              ((long)&((model->layers).
                                       super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->wk_b + local_e8),
                             pgVar16);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar16,"q_nope_absorbed",il);
      pgVar16 = (ggml_tensor *)ggml_permute((this->super_llm_graph_context).ctx0,pgVar16,0,2,1,3);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar16,"q_nope_absorbed_perm",il);
      pgVar13 = (ggml_tensor *)ggml_concat((this->super_llm_graph_context).ctx0,pgVar13,pgVar16,0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"Qcur",il);
      pgVar16 = (ggml_tensor *)
                ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar19,uVar24,1);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar16,"kv_cmpr_reshape",il);
      pgVar12 = (ggml_tensor *)ggml_concat((this->super_llm_graph_context).ctx0,pgVar12,pgVar16,0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"Kcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar16,"Vcur",il);
      plVar6 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar12 = llm_graph_context::build_attn
                          (&this->super_llm_graph_context,inp,gf,
                           *(ggml_tensor **)((long)&plVar6->wo + local_e8),(ggml_tensor *)0x0,
                           pgVar13,pgVar12,pgVar16,(ggml_tensor *)0x0,
                           *(ggml_tensor **)((long)&plVar6->wv_b + local_e8),fVar30,il);
    }
    else {
      pgVar19 = (ggml_tensor *)
                ggml_mul_mat(pgVar5,*(undefined8 *)
                                     ((long)&((model->layers).
                                              super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->wkv_b +
                                     local_e8),pgVar19);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar19,"kv",il);
      iVar7 = (this->super_llm_graph_context).n_head;
      pgVar5 = (this->super_llm_graph_context).ctx0;
      iVar3 = (this->super_llm_graph_context).n_tokens;
      uVar14 = ggml_row_size(pgVar19->type,lVar11);
      lVar15 = ggml_row_size(pgVar19->type,lVar11);
      cur = (ggml_tensor *)
            ggml_view_3d(pgVar5,pgVar19,lVar26,iVar7,(long)iVar3,uVar14,
                         lVar15 * (this->super_llm_graph_context).n_head,0);
      llm_graph_context::cb(&this->super_llm_graph_context,cur,"k_nope_view",il);
      iVar7 = (this->super_llm_graph_context).n_head;
      pgVar5 = (this->super_llm_graph_context).ctx0;
      iVar3 = (this->super_llm_graph_context).n_tokens;
      uVar14 = ggml_row_size(pgVar19->type,lVar11);
      lVar17 = ggml_row_size(pgVar19->type,lVar11);
      lVar15 = (this->super_llm_graph_context).n_head;
      uVar18 = ggml_row_size(pgVar19->type,lVar26);
      pgVar19 = (ggml_tensor *)
                ggml_view_3d(pgVar5,pgVar19,(ulong)uVar2,iVar7,(long)iVar3,uVar14,lVar15 * lVar17,
                             uVar18);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar19,"Vcur_view",il);
      pgVar19 = (ggml_tensor *)ggml_cont((this->super_llm_graph_context).ctx0,pgVar19);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar19,"Vcur_cont",il);
      pgVar16 = (ggml_tensor *)ggml_concat((this->super_llm_graph_context).ctx0,pgVar13,pgVar16,0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar16,"Qcur",il);
      pgVar5 = (this->super_llm_graph_context).ctx0;
      uVar14 = ggml_repeat(pgVar5,pgVar12,pgVar13);
      pgVar12 = (ggml_tensor *)ggml_concat(pgVar5,uVar14,cur,0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"Kcur",il);
      pgVar12 = llm_graph_context::build_attn
                          (&this->super_llm_graph_context,inp,gf,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->wo + local_e8),
                           (ggml_tensor *)0x0,pgVar16,pgVar12,pgVar19,(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,fVar30,il);
    }
    if (uVar27 == (this->super_llm_graph_context).n_layer - 1U) {
      pgVar13 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
      pgVar12 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar12,pgVar13);
      local_80 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,local_80,pgVar13)
      ;
    }
    pgVar12 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar12,local_80);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"ffn_inp",il);
    pgVar13 = llm_graph_context::build_norm
                        (&this->super_llm_graph_context,pgVar12,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->ffn_norm + local_e8),
                         (ggml_tensor *)0x0,LLM_NORM_RMS,il);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"ffn_norm",il);
    plVar4 = (this->super_llm_graph_context).hparams;
    plVar6 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar27 < plVar4->n_layer_dense_lead) {
      pgVar13 = llm_graph_context::build_ffn
                          (&this->super_llm_graph_context,pgVar13,
                           *(ggml_tensor **)((long)&plVar6->ffn_up + local_e8),(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar6->ffn_gate + local_e8),
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                           *(ggml_tensor **)((long)&plVar6->ffn_down + local_e8),(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,LLM_FFN_PAR,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"ffn_out",il);
    }
    else {
      pgVar16 = llm_graph_context::build_moe_ffn
                          (&this->super_llm_graph_context,pgVar13,
                           *(ggml_tensor **)((long)&plVar6->ffn_gate_inp + local_e8),
                           *(ggml_tensor **)((long)&plVar6->ffn_up_exps + local_e8),
                           *(ggml_tensor **)((long)&plVar6->ffn_gate_exps + local_e8),
                           *(ggml_tensor **)((long)&plVar6->ffn_down_exps + local_e8),
                           *(ggml_tensor **)((long)&plVar6->ffn_exp_probs_b + local_e8),
                           (this->super_llm_graph_context).n_expert,
                           (this->super_llm_graph_context).n_expert_used,LLM_FFN_SILU,
                           plVar4->expert_weights_norm,true,plVar4->expert_weights_scale,
                           plVar4->expert_gating_func,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar16,"ffn_moe_out",il);
      plVar6 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar13 = llm_graph_context::build_ffn
                          (&this->super_llm_graph_context,pgVar13,
                           *(ggml_tensor **)((long)&plVar6->ffn_up_shexp + local_e8),
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                           *(ggml_tensor **)((long)&plVar6->ffn_gate_shexp + local_e8),
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                           *(ggml_tensor **)((long)&plVar6->ffn_down_shexp + local_e8),
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,
                           LLM_FFN_PAR,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"ffn_shexp",il);
      pgVar13 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar16,pgVar13);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"ffn_out",il);
    }
    pgVar12 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar13,pgVar12);
    local_80 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar12,il);
    llm_graph_context::cb(&this->super_llm_graph_context,local_80,"l_out",il);
    local_e8 = local_e8 + 0x4f0;
  }
  pgVar9 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_80,model->output_norm,(ggml_tensor *)0x0,
                      LLM_NORM_RMS,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar9;
  pgVar9 = (ggml_tensor *)ggml_mul_mat((this->super_llm_graph_context).ctx0,model->output,pgVar9);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar9;
  ggml_build_forward_expand(gf,pgVar9);
  return;
}

Assistant:

llm_build_deepseek2(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        bool is_lite = (hparams.n_layer == 27);

        const bool is_mla = (hparams.n_embd_head_k_mla != 0 && hparams.n_embd_head_v_mla != 0);

        // note: these are the actual head sizes you get when treating as MHA or after "decompression" using wv_b for MLA
        const int64_t n_embd_head_k = is_mla ? hparams.n_embd_head_k_mla : hparams.n_embd_head_k;
        const int64_t n_embd_head_v = is_mla ? hparams.n_embd_head_v_mla : hparams.n_embd_head_v;

        const int64_t n_embd_head_qk_rope = hparams.n_rot;
        const int64_t n_embd_head_qk_nope = n_embd_head_k - n_embd_head_qk_rope;

        const uint32_t kv_lora_rank = hparams.n_lora_kv;

        // We have to pre-scale kq_scale and attn_factor to make the YaRN RoPE work correctly.
        // See https://github.com/ggerganov/llama.cpp/discussions/7416 for detailed explanation.
        const float mscale = attn_factor * (1.0f + hparams.rope_yarn_log_mul * logf(1.0f / freq_scale));
        const float kq_scale = 1.0f*mscale*mscale/sqrtf(float(n_embd_head_k));
        const float attn_factor = 1.0f / (1.0f + 0.1f * logf(1.0f / freq_scale));

        ggml_tensor * cur;
        ggml_tensor * inpL;

        // {n_embd, n_tokens}
        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self_attention
            {
                ggml_tensor * q = NULL;
                if (!is_lite) {
                    q = ggml_mul_mat(ctx0, model.layers[il].wq_a, cur);
                    cb(q, "q", il);

                    q = build_norm(q,
                            model.layers[il].attn_q_a_norm, nullptr,
                            LLM_NORM_RMS, il);
                    cb(q, "q", il);

                    q = ggml_mul_mat(ctx0, model.layers[il].wq_b, q);
                    cb(q, "q", il);
                } else {
                    q = ggml_mul_mat(ctx0, model.layers[il].wq, cur);
                    cb(q, "q", il);
                }

                // split into {n_embd_head_qk_nope, n_head, n_tokens}
                ggml_tensor * q_nope = ggml_view_3d(ctx0, q,
                        n_embd_head_qk_nope, n_head, n_tokens,
                        ggml_row_size(q->type, n_embd_head_k),
                        ggml_row_size(q->type, n_embd_head_k) * n_head,
                        0);
                cb(q_nope, "q_nope", il);

                // and {n_embd_head_qk_rope, n_head, n_tokens}
                ggml_tensor * q_pe = ggml_view_3d(ctx0, q,
                        n_embd_head_qk_rope, n_head, n_tokens,
                        ggml_row_size(q->type, n_embd_head_k),
                        ggml_row_size(q->type, n_embd_head_k) * n_head,
                        ggml_row_size(q->type, n_embd_head_qk_nope));
                cb(q_pe, "q_pe", il);

                ggml_tensor * kv_cmpr_pe = ggml_mul_mat(ctx0, model.layers[il].wkv_a_mqa, cur);
                cb(kv_cmpr_pe, "kv_cmpr_pe", il);

                // split into {kv_lora_rank, n_tokens}
                ggml_tensor * kv_cmpr = ggml_view_2d(ctx0, kv_cmpr_pe,
                        kv_lora_rank, n_tokens,
                        ggml_row_size(kv_cmpr_pe->type, kv_lora_rank + n_embd_head_qk_rope),
                        0);
                cb(kv_cmpr, "kv_cmpr", il);

                // and {n_embd_head_qk_rope, 1, n_tokens}
                ggml_tensor * k_pe = ggml_view_3d(ctx0, kv_cmpr_pe,
                        n_embd_head_qk_rope, 1, n_tokens,
                        ggml_row_size(kv_cmpr_pe->type, kv_lora_rank + n_embd_head_qk_rope),
                        ggml_row_size(kv_cmpr_pe->type, kv_lora_rank + n_embd_head_qk_rope),
                        ggml_row_size(kv_cmpr_pe->type, kv_lora_rank));
                cb(k_pe, "k_pe", il);

                q_pe = ggml_rope_ext(ctx0, q_pe, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                );
                cb(q_pe, "q_pe", il);

                k_pe = ggml_rope_ext(ctx0, k_pe, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                );
                cb(k_pe, "k_pe", il);

                kv_cmpr = build_norm(kv_cmpr,
                        model.layers[il].attn_kv_a_norm, nullptr,
                        LLM_NORM_RMS, il);
                cb(kv_cmpr, "kv_cmpr", il);

                if (is_mla) {
                    // {n_embd_head_qk_nope, n_tokens, n_head}
                    q_nope = ggml_permute(ctx0, q_nope, 0, 2, 1, 3);
                    cb(q_nope, "q_nope_perm", il);

                    // {n_embd_head_qk_nope, kv_lora_rank, n_head} x {n_embd_head_qk_nope, n_tokens, n_head}
                    ggml_tensor * q_nope_absorbed = ggml_mul_mat(ctx0, model.layers[il].wk_b, q_nope);
                    cb(q_nope_absorbed, "q_nope_absorbed", il);

                    // {kv_lora_rank, n_head, n_tokens}
                    q_nope_absorbed = ggml_permute(ctx0, q_nope_absorbed, 0, 2, 1, 3);
                    cb(q_nope_absorbed, "q_nope_absorbed_perm", il);

                    // {n_embd_head_qk_rope + kv_lora_rank, n_head, n_tokens}
                    // note: rope must go first for in-place context shifting in build_rope_shift()
                    ggml_tensor * Qcur = ggml_concat(ctx0, q_pe, q_nope_absorbed, 0);
                    cb(Qcur, "Qcur", il);

                    kv_cmpr = ggml_reshape_3d(ctx0, kv_cmpr, kv_lora_rank, 1, n_tokens);
                    cb(kv_cmpr, "kv_cmpr_reshape", il);

                    // {n_embd_head_qk_rope + kv_lora_rank, 1, n_tokens}
                    ggml_tensor * Kcur = ggml_concat(ctx0, k_pe, kv_cmpr, 0);
                    cb(Kcur, "Kcur", il);

                    // {kv_lora_rank, 1, n_tokens}
                    ggml_tensor * Vcur = kv_cmpr;
                    cb(Vcur, "Vcur", il);

                    // note: MLA with the absorption optimzation converts into MQA (ie: GQA with 1 group)
                    cur = build_attn(inp_attn, gf,
                            model.layers[il].wo, NULL,
                            Qcur, Kcur, Vcur, nullptr, model.layers[il].wv_b, kq_scale, il);
                } else {
                    ggml_tensor * kv = ggml_mul_mat(ctx0, model.layers[il].wkv_b, kv_cmpr);
                    cb(kv, "kv", il);

                    // split into {n_embd_head_qk_nope, n_head, n_tokens}
                    ggml_tensor * k_nope = ggml_view_3d(ctx0, kv,
                            n_embd_head_qk_nope, n_head, n_tokens,
                            ggml_row_size(kv->type, n_embd_head_qk_nope + n_embd_head_v),
                            ggml_row_size(kv->type, n_embd_head_qk_nope + n_embd_head_v) * n_head,
                            0);
                    cb(k_nope, "k_nope_view", il);

                    // and {n_embd_head_v, n_head, n_tokens}
                    ggml_tensor * Vcur = ggml_view_3d(ctx0, kv,
                            n_embd_head_v, n_head, n_tokens,
                            ggml_row_size(kv->type, n_embd_head_qk_nope + n_embd_head_v),
                            ggml_row_size(kv->type, n_embd_head_qk_nope + n_embd_head_v) * n_head,
                            ggml_row_size(kv->type, n_embd_head_qk_nope));
                    cb(Vcur, "Vcur_view", il);

                    Vcur = ggml_cont(ctx0, Vcur);
                    cb(Vcur, "Vcur_cont", il);

                    // note: rope must go first for in-place context shifting in build_rope_shift()
                    ggml_tensor * Qcur = ggml_concat(ctx0, q_pe, q_nope, 0);
                    cb(Qcur, "Qcur", il);

                    ggml_tensor * Kcur = ggml_concat(ctx0, ggml_repeat(ctx0, k_pe, q_pe), k_nope, 0);
                    cb(Kcur, "Kcur", il);

                    // note: MLA without the absorption optimization converts into MHA (ie: GQA with full n_head groups)
                    cur = build_attn(inp_attn, gf,
                            model.layers[il].wo, NULL,
                            Qcur, Kcur, Vcur, nullptr, nullptr, kq_scale, il);
                }
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            if ((uint32_t) il < hparams.n_layer_dense_lead) {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            } else {
                // MoE branch
                ggml_tensor * moe_out =
                    build_moe_ffn(cur,
                            model.layers[il].ffn_gate_inp,
                            model.layers[il].ffn_up_exps,
                            model.layers[il].ffn_gate_exps,
                            model.layers[il].ffn_down_exps,
                            model.layers[il].ffn_exp_probs_b,
                            n_expert, n_expert_used,
                            LLM_FFN_SILU, hparams.expert_weights_norm,
                            true, hparams.expert_weights_scale,
                            (llama_expert_gating_func_type) hparams.expert_gating_func,
                            il);
                cb(moe_out, "ffn_moe_out", il);

                // FFN shared expert
                {
                    ggml_tensor * ffn_shexp = build_ffn(cur,
                            model.layers[il].ffn_up_shexp,   NULL, NULL,
                            model.layers[il].ffn_gate_shexp, NULL, NULL,
                            model.layers[il].ffn_down_shexp, NULL, NULL,
                            NULL,
                            LLM_FFN_SILU, LLM_FFN_PAR, il);
                    cb(ffn_shexp, "ffn_shexp", il);

                    cur = ggml_add(ctx0, moe_out, ffn_shexp);
                    cb(cur, "ffn_out", il);
                }
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = ggml_mul_mat(ctx0, model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }